

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# translate.c
# Opt level: O2

void riscv_tr_translate_insn(DisasContextBase *dcbase,CPUState *cpu)

{
  target_ulong tVar1;
  uc_struct_conflict13 *env;
  target_ulong tVar2;
  uint64_t addr;
  long lVar3;
  TCGContext_conflict11 *tcg_ctx;
  _Bool _Var4;
  _Bool _Var5;
  byte bVar6;
  uint16_t uVar7;
  uint16_t uVar8;
  uint16_t uVar9;
  uint32_t uVar10;
  uint32_t uVar11;
  uintptr_t o_3;
  undefined1 *puVar12;
  TCGv_i32 pTVar13;
  TCGv_i64 pTVar14;
  TCGv_i64 pTVar15;
  uint uVar16;
  anon_union_16_2_88bb8dd4_for_ops_free_ops *paVar17;
  uint16_t insn;
  long *plVar18;
  uintptr_t o_1;
  TCGTemp *pTVar19;
  arg_ebreak *a;
  uint uVar20;
  uintptr_t o;
  TCGTemp *pTVar21;
  byte bVar22;
  uintptr_t o_2;
  arg_jal aVar23;
  TCGContext_conflict11 *pTVar24;
  undefined1 local_b8 [40];
  TCGContext_conflict11 *local_90;
  void *local_88;
  TCGTemp *local_80;
  TCGTemp *local_78;
  arg_jal local_70;
  DisasContext_conflict12 *local_68;
  uc_struct_conflict13 *local_60;
  TCGTemp *local_58;
  TCGTemp *local_50;
  arg_jal local_48;
  TCGTemp *local_40;
  
  tVar1 = dcbase[2].pc_first;
  pTVar24 = *(TCGContext_conflict11 **)(tVar1 + 0x2e8);
  env = (uc_struct_conflict13 *)cpu->env_ptr;
  uVar10 = cpu_lduw_code_riscv64((CPUArchState_conflict26 *)env,dcbase->pc_next);
  tVar2 = dcbase->pc_next;
  local_b8._0_4_ = (undefined4)tVar2;
  local_b8._4_4_ = (undefined4)(tVar2 >> 0x20);
  if (*(int *)(tVar1 + 0x57c) == 0) {
    if (*(target_ulong *)(tVar1 + 0x578 + (long)*(int *)(tVar1 + 0x39e0) * 8) == tVar2)
    goto LAB_00aa39b6;
  }
  else {
    puVar12 = (undefined1 *)g_tree_lookup(*(GTree **)(tVar1 + 0x780),local_b8);
    if (puVar12 == &DAT_00000001) {
LAB_00aa39b6:
      dcbase->is_jmp = DISAS_TARGET_6;
      return;
    }
  }
  addr = dcbase->pc_next;
  local_60 = env;
  _Var4 = _hook_exists_bounded(*(list_item **)(tVar1 + 0x358),addr);
  local_90 = pTVar24;
  if (_Var4) {
    tcg_gen_movi_i64_riscv64(pTVar24,pTVar24->cpu_pc,addr);
    local_88 = ((pTVar24->ops).tqh_circ.tql_prev)->tql_prev->tql_next;
    tVar2 = dcbase->pc_next;
    local_68 = (DisasContext_conflict12 *)dcbase;
    pTVar13 = tcg_const_i32_riscv64(pTVar24,4);
    pTVar14 = tcg_const_i64_riscv64(pTVar24,tVar1);
    pTVar15 = tcg_const_i64_riscv64(pTVar24,tVar2);
    tcg_ctx = local_90;
    pTVar21 = (TCGTemp *)(pTVar14 + (long)pTVar24);
    pTVar19 = (TCGTemp *)(pTVar15 + (long)pTVar24);
    aVar23 = (arg_jal)((long)pTVar13 + (long)pTVar24);
    local_40 = (TCGTemp *)0x0;
    local_80 = pTVar19;
    local_78 = pTVar21;
    local_70 = aVar23;
    local_58 = pTVar21;
    local_50 = pTVar19;
    local_48 = aVar23;
    if (*(int *)(tVar1 + 0x4f8) == 1) {
      plVar18 = (long *)(tVar1 + 0x358);
      while( true ) {
        plVar18 = (long *)*plVar18;
        if (plVar18 == (long *)0x0) break;
        lVar3 = plVar18[1];
        if (*(char *)(lVar3 + 0x14) == '\0') {
          pTVar14 = tcg_const_i64_riscv64(tcg_ctx,*(int64_t *)(lVar3 + 0x30));
          local_40 = (TCGTemp *)(pTVar14 + (long)tcg_ctx);
          (**(code **)(tVar1 + 0x178))(tVar1,lVar3,&local_58,4);
          tcg_temp_free_internal_riscv64(tcg_ctx,(TCGTemp *)(pTVar14 + (long)tcg_ctx));
        }
      }
    }
    else {
      pTVar13 = tcg_const_i32_riscv64(pTVar24,2);
      local_b8._16_8_ = pTVar21;
      local_b8._24_8_ = pTVar19;
      local_b8._0_8_ = aVar23;
      local_b8._8_8_ = (TCGTemp *)(pTVar13 + (long)&pTVar24->pool_cur);
      tcg_gen_callN_riscv64(pTVar24,helper_uc_tracecode,(TCGTemp *)0x0,4,(TCGTemp **)local_b8);
      tcg_temp_free_internal_riscv64(pTVar24,(TCGTemp *)(pTVar13 + (long)&pTVar24->pool_cur));
    }
    pTVar24 = local_90;
    tcg_temp_free_internal_riscv64(local_90,local_80);
    tcg_temp_free_internal_riscv64(pTVar24,local_78);
    tcg_temp_free_internal_riscv64(pTVar24,(TCGTemp *)local_70);
    check_exit_request_riscv64(pTVar24);
    dcbase = &local_68->base;
  }
  else {
    local_88 = (void *)0x0;
  }
  uVar20 = uVar10 & 0xffff;
  a = (arg_ebreak *)0x0;
  uVar9 = (uint16_t)uVar10;
  uVar7 = extract16(uVar9,0,2);
  if (uVar7 == 3) {
    uVar11 = cpu_lduw_code_riscv64
                       ((CPUArchState_conflict26 *)local_60,
                        (((DisasContext_conflict12 *)dcbase)->base).pc_next + 2);
    ((DisasContext_conflict12 *)dcbase)->pc_succ_insn =
         (((DisasContext_conflict12 *)dcbase)->base).pc_next + 4;
    _Var5 = decode_insn32((DisasContext_conflict12 *)dcbase,uVar10 & 0xffff | uVar11 << 0x10);
    if (_Var5) goto LAB_00aa3abf;
    ((DisasContext_conflict12 *)dcbase)->pc_succ_insn =
         (((DisasContext_conflict12 *)dcbase)->base).pc_next - 4;
LAB_00aa3ab7:
    gen_exception_illegal((DisasContext_conflict12 *)dcbase);
    goto LAB_00aa3abf;
  }
  if ((((DisasContext_conflict12 *)dcbase)->misa & 4) == 0) goto LAB_00aa3ab7;
  ((DisasContext_conflict12 *)dcbase)->invalid = false;
  ((DisasContext_conflict12 *)dcbase)->pc_succ_insn =
       (((DisasContext_conflict12 *)dcbase)->base).pc_next + 2;
  uVar16 = uVar10 & 0xe003;
  if ((short)uVar16 == -0x1ffe) {
    local_b8._4_4_ = 2;
    local_b8._0_4_ = (uVar10 >> 4 & 0x38 | uVar10 >> 10 & 7) << 3;
    local_b8._8_8_ = CONCAT44(local_b8._12_4_,uVar10 >> 2) & 0xffffffff0000001f;
LAB_00aa421d:
    trans_sd((DisasContext_conflict12 *)dcbase,(arg_sd *)local_b8);
  }
  else {
    if (uVar16 == 1) {
      local_b8._0_4_ = (int)(uVar10 << 0x13) >> 0x1f & 0xffffffe0U | uVar10 >> 2 & 0x1f;
      local_b8._4_4_ = uVar10 >> 7 & 0x1f;
      local_b8._8_4_ = local_b8._4_4_;
LAB_00aa41a1:
      trans_addi((DisasContext_conflict12 *)dcbase,(arg_addi *)local_b8);
      goto LAB_00aa4332;
    }
    if (uVar16 == 2) {
      uVar20 = (uVar10 & 0xffff) >> 7;
      local_b8._0_4_ = uVar20 & 0x1f;
      uVar20 = uVar20 & 0x20 | uVar10 >> 2 & 0x1f;
      local_b8._8_4_ = 0x40;
      if (uVar20 != 0) {
        local_b8._8_4_ = uVar20;
      }
      local_b8._4_4_ = local_b8._0_4_;
      _Var5 = trans_slli((DisasContext_conflict12 *)dcbase,(arg_slli *)local_b8);
      goto LAB_00aa3fcc;
    }
    if (uVar16 == 0x2000) {
      decode_insn16_extract_cl_d
                ((DisasContext_conflict12 *)local_b8,(arg_i_conflict *)(ulong)uVar20,insn);
LAB_00aa3fc1:
      _Var5 = trans_fld((DisasContext_conflict12 *)dcbase,(arg_fld *)local_b8);
      goto LAB_00aa3fcc;
    }
    if (uVar16 == 0x2001) {
      if ((uVar10 & 0xf80) == 0) goto LAB_00aa432a;
      local_b8._0_4_ = (int)(uVar10 << 0x13) >> 0x1f & 0xffffffe0U | uVar10 >> 2 & 0x1f;
      local_b8._4_4_ = uVar10 >> 7 & 0x1f;
      local_b8._8_4_ = local_b8._4_4_;
      trans_addiw((DisasContext_conflict12 *)dcbase,(arg_addiw *)local_b8);
      goto LAB_00aa4332;
    }
    if (uVar16 == 0x2002) {
      decode_insn16_extract_c_ldsp
                ((DisasContext_conflict12 *)local_b8,(arg_i_conflict *)(ulong)uVar20,insn);
      goto LAB_00aa3fc1;
    }
    if (uVar16 == 0x4000) {
      local_b8._0_4_ = (uVar10 >> 1 & 0x10 | uVar10 >> 9 & 0xe | uVar10 >> 6 & 1) << 2;
      local_b8._8_4_ = uVar10 >> 7 & 7 | 8;
      local_b8._4_4_ = uVar10 >> 2 & 7 | 8;
LAB_00aa3e81:
      trans_lw((DisasContext_conflict12 *)dcbase,(arg_lw *)local_b8);
      goto LAB_00aa4332;
    }
    if (uVar16 == 0x4001) {
      local_b8._0_4_ = (int)(uVar10 << 0x13) >> 0x1f & 0xffffffe0U | uVar10 >> 2 & 0x1f;
      local_b8._8_4_ = 0;
LAB_00aa3cc6:
      local_b8._4_4_ = uVar10 >> 7 & 0x1f;
      goto LAB_00aa41a1;
    }
    if (uVar16 == 0x4002) {
      if ((uVar10 & 0xf80) != 0) {
        local_b8._0_4_ = ((uVar10 >> 9 & 8 | uVar10 >> 4 & 7) + (uVar10 & 0xc) * 4) * 4;
        local_b8._8_4_ = 2;
        local_b8._4_4_ = uVar10 >> 7 & 0x1f;
        goto LAB_00aa3e81;
      }
      goto LAB_00aa432a;
    }
    if (uVar16 == 0x6000) {
      decode_insn16_extract_cl_d
                ((DisasContext_conflict12 *)local_b8,(arg_i_conflict *)(ulong)uVar20,insn);
LAB_00aa3d67:
      trans_ld((DisasContext_conflict12 *)dcbase,(arg_ld *)local_b8);
      goto LAB_00aa4332;
    }
    if (uVar16 == 0x6001) {
      if ((uVar10 & 0x107c) != 0) {
        if ((uVar10 & 0xf80) == 0x100) {
          local_b8._0_4_ =
               ((int)(uVar10 << 0x13) >> 0x1f & 0xfffffe0U |
               uVar10 & 0x18 | uVar10 >> 1 & 2 | uVar10 >> 6 & 1 | uVar10 >> 3 & 4) << 4;
          local_b8._4_4_ = 2;
          local_b8._8_4_ = 2;
          goto LAB_00aa41a1;
        }
        local_b8._0_4_ = ((int)(uVar10 << 0x13) >> 0x1f & 0xfffe0U | uVar10 >> 2 & 0x1f) << 0xc;
        local_b8._4_4_ = uVar10 >> 7 & 0x1f;
        trans_lui((DisasContext_conflict12 *)dcbase,(arg_lui *)local_b8);
        goto LAB_00aa4332;
      }
LAB_00aa432a:
      gen_exception_illegal((DisasContext_conflict12 *)dcbase);
      goto LAB_00aa4332;
    }
    if (uVar16 == 0x6002) {
      if ((uVar10 & 0xf80) != 0) {
        decode_insn16_extract_c_ldsp
                  ((DisasContext_conflict12 *)local_b8,(arg_i_conflict *)(ulong)uVar20,insn);
        goto LAB_00aa3d67;
      }
      goto LAB_00aa432a;
    }
    if (uVar16 != 0x8001) {
      if (uVar16 != 0x8002) {
        if (uVar16 == 0xa000) {
          decode_insn16_extract_cs_d
                    ((DisasContext_conflict12 *)local_b8,(arg_s *)(ulong)uVar20,insn);
        }
        else {
          if (uVar16 == 0xa001) {
            local_b8._0_4_ =
                 ((uVar10 >> 2 & 0x1a0 | uVar10 & 0x40 | uVar10 >> 8 & 8 | uVar10 >> 3 & 7) +
                  (uVar10 & 4) * 4 + (uVar10 & 0x100) * 2 |
                 (int)(uVar10 << 0x13) >> 0x1f & 0x7ffffc00U) * 2;
            local_b8._4_4_ = 0;
            trans_jal((DisasContext_conflict12 *)dcbase,(arg_jal *)local_b8);
            goto LAB_00aa4332;
          }
          if (uVar16 != 0xa002) {
            if (uVar16 == 0xc000) {
              local_b8._0_4_ = uVar10 >> 1 & 0x10 | uVar10 >> 9 & 0xe | uVar10 >> 6 & 1;
              local_b8._4_4_ = uVar10 >> 7 & 7 | 8;
              local_b8._8_4_ = uVar10 >> 2 & 7 | 8;
LAB_00aa3fa1:
              local_b8._0_4_ = local_b8._0_4_ << 2;
              trans_sw((DisasContext_conflict12 *)dcbase,(arg_sw *)local_b8);
            }
            else if (uVar16 == 0xc001) {
              decode_insn16_extract_cb_z
                        ((DisasContext_conflict12 *)local_b8,(arg_b *)(ulong)uVar20,insn);
              trans_beq((DisasContext_conflict12 *)dcbase,(arg_beq *)local_b8);
            }
            else {
              if (uVar16 == 0xc002) {
                local_b8._0_4_ = uVar10 >> 3 & 0x30 | uVar10 >> 9 & 0xf;
                local_b8._4_4_ = 2;
                local_b8._8_4_ = uVar10 >> 2 & 0x1f;
                goto LAB_00aa3fa1;
              }
              if (uVar16 == 0xe000) {
                decode_insn16_extract_cs_d
                          ((DisasContext_conflict12 *)local_b8,(arg_s *)(ulong)uVar20,insn);
                goto LAB_00aa421d;
              }
              if (uVar16 != 0xe001) {
                aVar23 = (arg_jal)local_b8._0_8_;
                pTVar19 = (TCGTemp *)local_b8._8_8_;
                if (uVar16 != 0) goto LAB_00aa3fd4;
                if ((uVar10 & 0x1fe0) != 0) {
                  local_b8._0_4_ =
                       (uVar10 >> 3 & 0xf0 | uVar10 >> 9 & 0xc | uVar10 >> 4 & 2 | uVar10 >> 6 & 1)
                       << 2;
                  local_b8._8_4_ = 2;
                  local_b8._4_4_ = uVar10 >> 2 & 7 | 8;
                  goto LAB_00aa41a1;
                }
                ((DisasContext_conflict12 *)dcbase)->invalid = true;
                goto LAB_00aa432a;
              }
              decode_insn16_extract_cb_z
                        ((DisasContext_conflict12 *)local_b8,(arg_b *)(ulong)uVar20,insn);
              trans_bne((DisasContext_conflict12 *)dcbase,(arg_bne *)local_b8);
            }
            goto LAB_00aa4332;
          }
          local_b8._4_4_ = 2;
          local_b8._0_4_ = (uVar10 >> 4 & 0x38 | uVar10 >> 10 & 7) << 3;
          local_b8._8_8_ = CONCAT44(local_b8._12_4_,uVar10 >> 2) & 0xffffffff0000001f;
        }
        _Var5 = trans_fsd((DisasContext_conflict12 *)dcbase,(arg_fsd *)local_b8);
        goto LAB_00aa3fcc;
      }
      if ((uVar10 >> 0xc & 1) == 0) {
        if ((uVar10 & 0xffc) == 0) goto LAB_00aa432a;
        local_b8._0_4_ = 0;
        if ((uVar10 & 0x7c) != 0) {
          local_b8._8_4_ = uVar10 >> 2 & 0x1f;
          goto LAB_00aa3cc6;
        }
        local_b8._4_4_ = 0;
LAB_00aa4482:
        local_b8._8_4_ = uVar10 >> 7 & 0x1f;
        local_b8._0_4_ = 0;
        trans_jalr((DisasContext_conflict12 *)dcbase,(arg_jalr *)local_b8);
      }
      else if ((uVar10 & 0xffc) == 0) {
        trans_ebreak((DisasContext_conflict12 *)dcbase,a);
      }
      else {
        if ((uVar10 & 0x7c) == 0) {
          local_b8._4_4_ = 1;
          goto LAB_00aa4482;
        }
        local_b8._8_4_ = uVar10 >> 2 & 0x1f;
        local_b8._0_4_ = uVar10 >> 7 & 0x1f;
        local_b8._4_4_ = local_b8._0_4_;
        trans_add((DisasContext_conflict12 *)dcbase,(arg_add *)local_b8);
      }
      goto LAB_00aa4332;
    }
    switch(uVar10 >> 10 & 3) {
    case 0:
      decode_insn16_extract_c_shift
                ((DisasContext_conflict12 *)local_b8,(arg_shift *)(ulong)uVar20,insn);
      _Var5 = trans_srli((DisasContext_conflict12 *)dcbase,(arg_srli *)local_b8);
      break;
    case 1:
      decode_insn16_extract_c_shift
                ((DisasContext_conflict12 *)local_b8,(arg_shift *)(ulong)uVar20,insn);
      _Var5 = trans_srai((DisasContext_conflict12 *)dcbase,(arg_srai *)local_b8);
      break;
    case 2:
      local_b8._0_4_ = (int)(uVar10 << 0x13) >> 0x1f & 0xffffffe0U | uVar10 >> 2 & 0x1f;
      local_b8._4_4_ = uVar10 >> 7 & 7 | 8;
      local_b8._8_4_ = local_b8._4_4_;
      trans_andi((DisasContext_conflict12 *)dcbase,(arg_andi *)local_b8);
      goto LAB_00aa4332;
    case 3:
      local_b8._8_4_ = uVar10 >> 2 & 7 | 8;
      pTVar19 = (TCGTemp *)(CONCAT44(local_b8._12_4_,uVar10 >> 2) & 0xffffffff00000007 | 8);
      uVar20 = uVar10 >> 7;
      local_b8._0_4_ = uVar20 & 7 | 8;
      aVar23 = (arg_jal)(CONCAT44(uVar20,uVar20) & 0x700000007 | 0x800000008);
      uVar20 = uVar10 & 0x1060;
      local_b8._4_4_ = local_b8._0_4_;
      if (uVar20 == 0x1020) {
        trans_addw((DisasContext_conflict12 *)dcbase,(arg_addw *)local_b8);
        goto LAB_00aa4332;
      }
      if (uVar20 == 0x20) {
        trans_xor((DisasContext_conflict12 *)dcbase,(arg_xor *)local_b8);
        goto LAB_00aa4332;
      }
      if (uVar20 == 0x40) {
        trans_or((DisasContext_conflict12 *)dcbase,(arg_or *)local_b8);
        goto LAB_00aa4332;
      }
      if (uVar20 == 0x60) {
        trans_and((DisasContext_conflict12 *)dcbase,(arg_and *)local_b8);
        goto LAB_00aa4332;
      }
      if (uVar20 == 0x1000) {
        trans_subw((DisasContext_conflict12 *)dcbase,(arg_subw *)local_b8);
        goto LAB_00aa4332;
      }
      if (uVar20 == 0) {
        trans_sub((DisasContext_conflict12 *)dcbase,(arg_sub *)local_b8);
        goto LAB_00aa4332;
      }
      goto LAB_00aa3fd4;
    }
LAB_00aa3fcc:
    aVar23 = (arg_jal)local_b8._0_8_;
    pTVar19 = (TCGTemp *)local_b8._8_8_;
    if (_Var5 == false) {
LAB_00aa3fd4:
      local_b8._0_8_ = aVar23;
      local_b8._8_8_ = pTVar19;
      uVar7 = extract16(uVar9,0,2);
      if ((char)uVar7 == '\0') {
        uVar7 = extract16(uVar9,0xd,3);
        uVar8 = extract16(uVar9,2,3);
        bVar22 = (char)uVar8 + 8;
        uVar8 = extract16(uVar9,7,3);
        bVar6 = (char)uVar8 + 8;
        if ((char)uVar7 == '\a') {
          uVar7 = extract16(uVar9,10,3);
          uVar9 = extract16(uVar9,5,2);
          pTVar24 = ((DisasContext_conflict12 *)dcbase)->uc->tcg_ctx;
          pTVar14 = tcg_temp_new_i64(pTVar24);
          pTVar15 = tcg_temp_new_i64(pTVar24);
          gen_get_gpr(pTVar24,pTVar14,(uint)bVar6);
          tcg_gen_addi_i64_riscv64
                    (pTVar24,pTVar14,pTVar14,(ulong)((uint)uVar9 << 6 | (uVar7 & 0x1fff) << 3));
          gen_get_gpr(pTVar24,pTVar15,(uint)bVar22);
          tcg_gen_qemu_st_i64_riscv64
                    (pTVar24,pTVar15,pTVar14,(ulong)((DisasContext_conflict12 *)dcbase)->mem_idx,
                     MO_64);
        }
        else {
          if ((char)uVar7 != '\x03') goto LAB_00aa3abf;
          uVar7 = extract16(uVar9,10,3);
          uVar9 = extract16(uVar9,5,2);
          pTVar24 = ((DisasContext_conflict12 *)dcbase)->uc->tcg_ctx;
          pTVar14 = tcg_temp_new_i64(pTVar24);
          pTVar15 = tcg_temp_new_i64(pTVar24);
          gen_get_gpr(pTVar24,pTVar14,(uint)bVar6);
          tcg_gen_addi_i64_riscv64
                    (pTVar24,pTVar14,pTVar14,(ulong)((uint)uVar9 << 6 | (uVar7 & 0x1fff) << 3));
          tcg_gen_qemu_ld_i64_riscv64
                    (pTVar24,pTVar15,pTVar14,(ulong)((DisasContext_conflict12 *)dcbase)->mem_idx,
                     MO_64);
          gen_set_gpr(pTVar24,(uint)bVar22,pTVar15);
        }
        tcg_temp_free_internal_riscv64(pTVar24,(TCGTemp *)(pTVar14 + (long)pTVar24));
        tcg_temp_free_internal_riscv64(pTVar24,(TCGTemp *)(pTVar15 + (long)pTVar24));
      }
      goto LAB_00aa3abf;
    }
  }
LAB_00aa4332:
  if (((DisasContext_conflict12 *)dcbase)->invalid == true) {
    ((DisasContext_conflict12 *)dcbase)->pc_succ_insn =
         ((DisasContext_conflict12 *)dcbase)->pc_succ_insn - 2;
  }
LAB_00aa3abf:
  if (_Var4) {
    paVar17 = &local_90->ops;
    if (local_88 != (void *)0x0) {
      paVar17 = (anon_union_16_2_88bb8dd4_for_ops_free_ops *)((long)local_88 + 8);
    }
    paVar17->tqh_first->args[1] =
         ((DisasContext_conflict12 *)dcbase)->pc_succ_insn -
         (((DisasContext_conflict12 *)dcbase)->base).pc_next;
  }
  tVar1 = ((DisasContext_conflict12 *)dcbase)->pc_succ_insn;
  (((DisasContext_conflict12 *)dcbase)->base).pc_next = tVar1;
  if (((((DisasContext_conflict12 *)dcbase)->base).is_jmp == DISAS_NEXT) &&
     (0xfff < tVar1 - ((((DisasContext_conflict12 *)dcbase)->base).pc_first & 0xfffffffffffff000)))
  {
    (((DisasContext_conflict12 *)dcbase)->base).is_jmp = DISAS_TOO_MANY;
  }
  return;
}

Assistant:

static void riscv_tr_translate_insn(DisasContextBase *dcbase, CPUState *cpu)
{
    DisasContext *ctx = container_of(dcbase, DisasContext, base);
    struct uc_struct *uc = ctx->uc;
    TCGContext *tcg_ctx = uc->tcg_ctx;
    CPURISCVState *env = cpu->env_ptr;
    uint16_t opcode16 = translator_lduw(tcg_ctx, env, ctx->base.pc_next);
    TCGOp *tcg_op, *prev_op = NULL;
    bool insn_hook = false;

    // Unicorn: end address tells us to stop emulation
    if (uc_addr_is_exit(uc, ctx->base.pc_next)) {
        // Unicorn: We have to exit current execution here.
        dcbase->is_jmp = DISAS_UC_EXIT;
    } else {
        // Unicorn: trace this instruction on request
        if (HOOK_EXISTS_BOUNDED(uc, UC_HOOK_CODE, ctx->base.pc_next)) {

            // Sync PC in advance
            tcg_gen_movi_tl(tcg_ctx, tcg_ctx->cpu_pc, ctx->base.pc_next);

            // save the last operand
            prev_op = tcg_last_op(tcg_ctx);
            insn_hook = true;
            gen_uc_tracecode(tcg_ctx, 4, UC_HOOK_CODE_IDX, uc, ctx->base.pc_next);
            // the callback might want to stop emulation immediately
            check_exit_request(tcg_ctx);
        }

        decode_opc(env, ctx, opcode16);

        if (insn_hook) {
            // Unicorn: patch the callback to have the proper instruction size.
            if (prev_op) {
                // As explained further up in the function where prev_op is
                // assigned, we move forward in the tail queue, so we're modifying the
                // move instruction generated by gen_uc_tracecode() that contains
                // the instruction size to assign the proper size (replacing 0xF1F1F1F1).
                tcg_op = QTAILQ_NEXT(prev_op, link);
            } else {
                // this instruction is the first emulated code ever,
                // so the instruction operand is the first operand
                tcg_op = QTAILQ_FIRST(&tcg_ctx->ops);
            }

            tcg_op->args[1] = ctx->pc_succ_insn - ctx->base.pc_next;
        }

        ctx->base.pc_next = ctx->pc_succ_insn;

        if (ctx->base.is_jmp == DISAS_NEXT) {
            target_ulong page_start;

            page_start = ctx->base.pc_first & TARGET_PAGE_MASK;
            if (ctx->base.pc_next - page_start >= TARGET_PAGE_SIZE) {
                ctx->base.is_jmp = DISAS_TOO_MANY;
            }
        }
    }
}